

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O1

double __thiscall
chrono::ChLinkLimit::GetPolarForce(ChLinkLimit *this,double x,double x_dt,double pol_ang)

{
  bool bVar1;
  double dVar2;
  element_type *peVar3;
  double dVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar12 [64];
  double dVar13;
  
  auVar12._8_56_ = in_register_00001288;
  auVar12._0_8_ = pol_ang;
  peVar3 = (this->m_polarMax_funct).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar13 = 0.0;
  if (peVar3 != (element_type *)0x0) {
    bVar1 = this->m_penalty_only;
    dVar13 = this->m_max;
    auVar11 = auVar12._0_16_;
    (*peVar3->_vptr_ChFunction[4])();
    if ((double)((ulong)(bVar1 & 1) * 0x41cdcd64ff800000 + (ulong)!(bool)(bVar1 & 1) * (long)dVar13)
        <= x) {
      dVar13 = 0.0;
    }
    else {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = this->m_maxCushion;
      dVar4 = auVar11._0_8_ - this->m_maxCushion;
      dVar13 = 0.0;
      if (dVar4 < x) {
        auVar11 = vminsd_avx(auVar11,auVar9);
        dVar4 = x - dVar4;
        uVar5 = vcmpsd_avx512f(auVar11,ZEXT816(0x3e7ad7f29abcaf48),9);
        bVar1 = (bool)((byte)uVar5 & 1);
        auVar6._0_8_ = (ulong)bVar1 * 0x3ff0000000000000 +
                       (ulong)!bVar1 * (long)(dVar4 / auVar11._0_8_);
        auVar6._8_8_ = 0;
        auVar11 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar6);
        auVar8._0_8_ = auVar11._0_8_;
        dVar13 = this->m_Kmax;
        dVar7 = auVar8._0_8_;
        (*((this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_ChFunction[4])();
        dVar2 = this->m_Rmax;
        auVar8._8_8_ = 0;
        (*((this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_ChFunction[4])();
        auVar10._8_8_ = 0;
        auVar10._0_8_ = x_dt * dVar2;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar7 * dVar4 * dVar13;
        auVar11 = vfnmsub213sd_fma(auVar8,auVar10,auVar11);
        auVar11 = vminsd_avx(ZEXT816(0),auVar11);
        dVar13 = auVar11._0_8_;
      }
    }
  }
  return dVar13;
}

Assistant:

double ChLinkLimit::GetPolarForce(double x, double x_dt, double pol_ang) const {
    double cush_coord;
    double cush_coord_norm;
    double cushion_thick;
    double force;
    double max_val;
    double ang_max;

    if (!m_polarMax_funct)
        return 0;

    if (!m_penalty_only) {
        max_val = m_max;
    } else {
        max_val = 999999999;
    }

    ang_max = m_polarMax_funct->Get_y(pol_ang);

    if (x < max_val && x > ang_max - m_maxCushion) {
        cushion_thick = m_maxCushion;
        if (cushion_thick > ang_max)
            cushion_thick = ang_max;

        cush_coord = x - (ang_max - m_maxCushion);

        if (cushion_thick >= 0.0000001)
            cush_coord_norm = cush_coord / cushion_thick;
        else
            cush_coord_norm = 1;

        // clip cushion forces at stopper limit
        if (cush_coord_norm > 1)
            cush_coord_norm = 1;

        force = (-cush_coord) * m_Kmax * m_Kmax_modul->Get_y(cush_coord_norm);
        force += (-x_dt) * m_Rmax * m_Rmax_modul->Get_y(cush_coord_norm);

        // damping could cause pos force while going away,
        // so, since the limit is not "sticky", clip force sign.
        if (force > 0) {
            force = 0;
        }
        return (force);
    }

    return 0;
}